

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_socket_finished_connecting_(int fd)

{
  int iVar1;
  int *piVar2;
  int e;
  socklen_t elen;
  
  elen = 4;
  iVar1 = getsockopt(fd,1,4,&e,&elen);
  if (-1 < iVar1) {
    if (e == 0) {
      return 1;
    }
    if ((e == 4) || (e == 0x73)) {
      return 0;
    }
    piVar2 = __errno_location();
    *piVar2 = e;
  }
  return -1;
}

Assistant:

int
evutil_socket_finished_connecting_(evutil_socket_t fd)
{
	int e;
	ev_socklen_t elen = sizeof(e);

	if (getsockopt(fd, SOL_SOCKET, SO_ERROR, (void*)&e, &elen) < 0)
		return -1;

	if (e) {
		if (EVUTIL_ERR_CONNECT_RETRIABLE(e))
			return 0;
		EVUTIL_SET_SOCKET_ERROR(e);
		return -1;
	}

	return 1;
}